

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdpeer.cc
# Opt level: O2

int operator==(bdNodeId *a,bdNodeId *b)

{
  long lVar1;
  uint8_t *b_data;
  uint8_t *a_data;
  
  for (lVar1 = 0; ((uint)lVar1 != 0x14 && (a->data[lVar1] == b->data[lVar1])); lVar1 = lVar1 + 1) {
  }
  return (int)(0x13 < (uint)lVar1);
}

Assistant:

int operator==(const bdNodeId &a, const bdNodeId &b) {
	uint8_t *a_data = (uint8_t *) a.data;
	uint8_t *b_data = (uint8_t *) b.data;
	for (int i = 0; i < BITDHT_KEY_LEN; i++)
	{
		if (*a_data < *b_data) {
			return 0;
		}
		else if (*a_data > *b_data) {
			return 0;
		}
		a_data++;
		b_data++;
	}
	return 1;
}